

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactBvh.cpp
# Opt level: O2

int __thiscall
btBvhTree::_sort_and_calc_splitting_index
          (btBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes,int startIndex,int endIndex,
          int splitAxis)

{
  GIM_BVH_DATA *pGVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int index1;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  btVector3 bVar12;
  undefined8 local_50;
  float local_48;
  undefined4 local_44;
  btVector3 center;
  
  local_44 = 0;
  lVar7 = (long)startIndex;
  lVar4 = lVar7 * 0x24;
  fVar10 = 0.0;
  fVar11 = 0.0;
  fVar9 = 0.0;
  for (lVar6 = lVar7; lVar6 < endIndex; lVar6 = lVar6 + 1) {
    pGVar1 = (primitive_boxes->super_btAlignedObjectArray<GIM_BVH_DATA>).m_data;
    bVar12 = operator+((btVector3 *)((long)(pGVar1->m_bound).m_max.m_floats + lVar4),
                       (btVector3 *)((long)(pGVar1->m_bound).m_min.m_floats + lVar4));
    fVar10 = fVar10 + bVar12.m_floats[0] * 0.5;
    fVar11 = fVar11 + bVar12.m_floats[1] * 0.5;
    fVar9 = fVar9 + bVar12.m_floats[2] * 0.5;
    lVar4 = lVar4 + 0x24;
  }
  iVar2 = endIndex - startIndex;
  fVar8 = 1.0 / (float)iVar2;
  local_50 = CONCAT44(fVar8 * fVar11,fVar8 * fVar10);
  local_48 = fVar8 * fVar9;
  fVar9 = *(float *)((long)&local_50 + (long)splitAxis * 4);
  lVar6 = lVar7 * 0x24;
  index1 = startIndex;
  for (; lVar7 < endIndex; lVar7 = lVar7 + 1) {
    pGVar1 = (primitive_boxes->super_btAlignedObjectArray<GIM_BVH_DATA>).m_data;
    bVar12 = operator+((btVector3 *)((long)(pGVar1->m_bound).m_max.m_floats + lVar6),
                       (btVector3 *)((long)(pGVar1->m_bound).m_min.m_floats + lVar6));
    center.m_floats[0] = bVar12.m_floats[0] * 0.5;
    center.m_floats[1] = bVar12.m_floats[1] * 0.5;
    center.m_floats[2] = bVar12.m_floats[2] * 0.5;
    center.m_floats[3] = 0.0;
    if (fVar9 < center.m_floats[splitAxis]) {
      btAlignedObjectArray<GIM_BVH_DATA>::swap
                (&primitive_boxes->super_btAlignedObjectArray<GIM_BVH_DATA>,(int)lVar7,index1);
      index1 = index1 + 1;
    }
    lVar6 = lVar6 + 0x24;
  }
  iVar5 = (iVar2 >> 1) + startIndex;
  iVar3 = index1;
  if (~(iVar2 / 3) + endIndex <= index1) {
    iVar3 = iVar5;
  }
  if (index1 <= iVar2 / 3 + startIndex) {
    iVar3 = iVar5;
  }
  return iVar3;
}

Assistant:

int btBvhTree::_sort_and_calc_splitting_index(
	GIM_BVH_DATA_ARRAY & primitive_boxes, int startIndex,
	int endIndex, int splitAxis)
{
	int i;
	int splitIndex =startIndex;
	int numIndices = endIndex - startIndex;

	// average of centers
	btScalar splitValue = 0.0f;

	btVector3 means(btScalar(0.),btScalar(0.),btScalar(0.));
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		means+=center;
	}
	means *= (btScalar(1.)/(btScalar)numIndices);

	splitValue = means[splitAxis];


	//sort leafNodes so all values larger then splitValue comes first, and smaller values start from 'splitIndex'.
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		if (center[splitAxis] > splitValue)
		{
			//swap
			primitive_boxes.swap(i,splitIndex);
			//swapLeafNodes(i,splitIndex);
			splitIndex++;
		}
	}

	//if the splitIndex causes unbalanced trees, fix this by using the center in between startIndex and endIndex
	//otherwise the tree-building might fail due to stack-overflows in certain cases.
	//unbalanced1 is unsafe: it can cause stack overflows
	//bool unbalanced1 = ((splitIndex==startIndex) || (splitIndex == (endIndex-1)));

	//unbalanced2 should work too: always use center (perfect balanced trees)
	//bool unbalanced2 = true;

	//this should be safe too:
	int rangeBalancedIndices = numIndices/3;
	bool unbalanced = ((splitIndex<=(startIndex+rangeBalancedIndices)) || (splitIndex >=(endIndex-1-rangeBalancedIndices)));

	if (unbalanced)
	{
		splitIndex = startIndex+ (numIndices>>1);
	}

	btAssert(!((splitIndex==startIndex) || (splitIndex == (endIndex))));

	return splitIndex;

}